

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O1

int fffrwc(fitsfile *fptr,char *expr,char *timeCol,char *parCol,char *valCol,long ntimes,
          double *times,char *time_status,int *status)

{
  size_t __size;
  iteratorCol *piVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  long nelem;
  int local_204;
  long local_200;
  long alen;
  iteratorCol *local_1f0;
  long local_1e8;
  int naxis;
  int typecode;
  long width;
  ParseData lParse;
  parseInfo Info;
  long naxes [5];
  
  iVar2 = *status;
  if (iVar2 == 0) {
    memset(&Info,0,0x90);
    iVar2 = ffiprs(fptr,1,expr,5,&Info.datatype,&nelem,&naxis,naxes,&lParse,status);
    if (iVar2 == 0) {
      ffgcno(fptr,0,timeCol,&lParse.timeCol,status);
      ffgcno(fptr,0,parCol,&lParse.parCol,status);
      ffgcno(fptr,0,valCol,&lParse.valCol,status);
      iVar3 = lParse.nCols;
      local_200 = nelem;
      iVar2 = *status;
      if (iVar2 == 0) {
        local_204 = 0;
        if (nelem < 0) {
          nelem = -nelem;
          lParse.nCols = 0;
          local_204 = iVar3;
        }
        if ((Info.datatype == 0xe) && (nelem == 1)) {
          lVar8 = (long)lParse.nCols;
          local_1e8 = ntimes + 1;
          __size = ntimes * 8 + 8;
          iVar2 = lParse.nCols + -2;
          do {
            iVar3 = iVar2;
            piVar1 = lParse.colData;
            iVar2 = local_204;
            bVar9 = lVar8 == 0;
            lVar8 = lVar8 + -1;
            if (bVar9) {
              iVar3 = fits_uncompress_hkdata(&lParse,fptr,ntimes,times,status);
              if (iVar3 == 0) {
                if (local_200 < 0) {
                  if (ntimes != 0) {
                    memset(time_status,*(int *)&lParse.Nodes[lParse.resultNode].value.data,ntimes);
                  }
                }
                else {
                  Info.dataPtr = time_status;
                  Info.nullPtr = (void *)0x0;
                  Info.maxRows = ntimes;
                  iVar3 = fits_parser_workfn(ntimes,0,1,ntimes,lParse.nCols,lParse.colData,&Info);
                  *status = iVar3;
                }
              }
              lVar8 = (long)lParse.nCols;
              if (lVar8 != 0) {
                lVar7 = lVar8 * 0x110 + -0xb0;
                do {
                  if (*(int *)((lParse.colData)->colname + lVar7 + -0x18) == 0x10) {
                    if ((void *)**(undefined8 **)((lParse.colData)->colname + lVar7 + -0xc) ==
                        (void *)0x0) {
                      printf("invalid free(((char **)lParse.colData[parNo].array)[0]) at %s:%d\n",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                             ,0x7f7);
                    }
                    else {
                      free((void *)**(undefined8 **)((lParse.colData)->colname + lVar7 + -0xc));
                    }
                  }
                  if (*(void **)((lParse.colData)->colname + lVar7 + -0xc) == (void *)0x0) {
                    printf("invalid free(lParse.colData[parNo].array) at %s:%d\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                           ,0x7f8);
                  }
                  else {
                    free(*(void **)((lParse.colData)->colname + lVar7 + -0xc));
                  }
                  lVar8 = lVar8 + -1;
                  lVar7 = lVar7 + -0x110;
                } while (lVar8 != 0);
              }
              if (local_200 < 0) {
                lParse.nCols = iVar2;
              }
              ffcprs(&lParse);
              goto LAB_0014734a;
            }
            iVar2 = lParse.colData[lVar8].datatype;
            if (iVar2 == 0x10) {
              iVar2 = ffgtcl(fptr,lParse.valCol,&typecode,&alen,&width,status);
              if (iVar2 == 0) {
                lVar7 = alen + 1;
                alen = lVar7;
                puVar4 = (undefined8 *)malloc(__size);
                lParse.colData[lVar8].array = puVar4;
                if (puVar4 != (undefined8 *)0x0) {
                  local_1f0 = lParse.colData;
                  pvVar5 = malloc(lVar7 * local_1e8);
                  *puVar4 = pvVar5;
                  if (pvVar5 != (void *)0x0) {
                    if (0 < ntimes) {
                      lVar6 = 0;
                      do {
                        *(long *)((long)lParse.colData[lVar8].array + lVar6 * 8 + 8) =
                             *(long *)((long)lParse.colData[lVar8].array + lVar6 * 8) + lVar7;
                        lVar6 = lVar6 + 1;
                      } while (ntimes != lVar6);
                    }
                    **lParse.colData[lVar8].array = 0;
                    goto LAB_001470f6;
                  }
                  free(local_1f0[lVar8].array);
                }
LAB_001470e0:
                *status = 0x71;
              }
            }
            else if (iVar2 == 0x52) {
              puVar4 = (undefined8 *)malloc(__size);
              piVar1[lVar8].array = puVar4;
              if (puVar4 == (undefined8 *)0x0) goto LAB_001470e0;
              *puVar4 = 0xb8a83e285ebab4b7;
            }
            else if (iVar2 == 0x29) {
              puVar4 = (undefined8 *)malloc(__size);
              piVar1[lVar8].array = puVar4;
              if (puVar4 == (undefined8 *)0x0) goto LAB_001470e0;
              *puVar4 = 0x4995cdd1;
            }
LAB_001470f6:
            iVar2 = iVar3 + -1;
          } while (*status == 0);
          if (lVar8 != 0) {
            lVar8 = (long)iVar3 + 1;
            lVar7 = (long)iVar3 * 0x110 + 0x60;
            do {
              if (*(int *)((lParse.colData)->colname + lVar7 + -0x18) == 0x10) {
                if ((void *)**(undefined8 **)((lParse.colData)->colname + lVar7 + -0xc) ==
                    (void *)0x0) {
                  printf("invalid free(((char **)lParse.colData[parNo].array)[0]) at %s:%d\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                         ,0x7d7);
                }
                else {
                  free((void *)**(undefined8 **)((lParse.colData)->colname + lVar7 + -0xc));
                }
              }
              if (*(void **)((lParse.colData)->colname + lVar7 + -0xc) == (void *)0x0) {
                printf("invalid free(lParse.colData[parNo].array) at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                       ,0x7d8);
              }
              else {
                free(*(void **)((lParse.colData)->colname + lVar7 + -0xc));
              }
              lVar7 = lVar7 + -0x110;
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
LAB_0014734a:
          iVar2 = *status;
        }
        else {
          ffcprs(&lParse);
          ffpmsg("Expression does not evaluate to a logical scalar.");
          *status = 0x1b0;
          iVar2 = 0x1b0;
        }
      }
    }
    else {
      ffcprs(&lParse);
      iVar2 = *status;
    }
  }
  return iVar2;
}

Assistant:

int fffrwc( fitsfile *fptr,        /* I - Input FITS file                    */
            char     *expr,        /* I - Boolean expression                 */
            char     *timeCol,     /* I - Name of time column                */
            char     *parCol,      /* I - Name of parameter column           */
            char     *valCol,      /* I - Name of value column               */
            long     ntimes,       /* I - Number of distinct times in file   */
            double   *times,       /* O - Array of times in file             */
            char     *time_status, /* O - Array of boolean results           */
            int      *status )     /* O - Error status                       */
/*                                                                           */
/* Evaluate a boolean expression for each time in a compressed file,         */
/* returning an array of flags indicating which times evaluated to TRUE/FALSE*/
/*---------------------------------------------------------------------------*/
{
   parseInfo Info;
   long alen, width;
   int parNo, typecode;
   int naxis, constant, nCol=0;
   long nelem, naxes[MAXDIMS], elem;
   char result;
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( fptr, 1, expr, MAXDIMS, &Info.datatype, &nelem,
               &naxis, naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }

   fits_get_colnum( fptr, CASEINSEN, timeCol, &lParse.timeCol, status );
   fits_get_colnum( fptr, CASEINSEN, parCol,  &lParse.parCol , status );
   fits_get_colnum( fptr, CASEINSEN, valCol,  &lParse.valCol, status );
   if( *status ) return( *status );
   
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
      nCol = lParse.nCols;
      lParse.nCols = 0;    /*  Ignore all column references  */
   } else
      constant = 0;

   if( Info.datatype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   /*******************************************/
   /* Allocate data arrays for each parameter */
   /*******************************************/
   
   parNo = lParse.nCols;
   while( parNo-- ) {
      switch( lParse.colData[parNo].datatype ) {
      case TLONG:
         if( (lParse.colData[parNo].array =
              (long *)malloc( (ntimes+1)*sizeof(long) )) )
            ((long*)lParse.colData[parNo].array)[0] = 1234554321;
         else
            *status = MEMORY_ALLOCATION;
         break;
      case TDOUBLE:
         if( (lParse.colData[parNo].array =
              (double *)malloc( (ntimes+1)*sizeof(double) )) )
            ((double*)lParse.colData[parNo].array)[0] = DOUBLENULLVALUE;
         else
            *status = MEMORY_ALLOCATION;
         break;
      case TSTRING:
         if( !fits_get_coltype( fptr, lParse.valCol, &typecode,
                                &alen, &width, status ) ) {
            alen++;
            if( (lParse.colData[parNo].array =
                 (char **)malloc( (ntimes+1)*sizeof(char*) )) ) {
               if( (((char **)lParse.colData[parNo].array)[0] =
                    (char *)malloc( (ntimes+1)*sizeof(char)*alen )) ) {
                  for( elem=1; elem<=ntimes; elem++ )
                     ((char **)lParse.colData[parNo].array)[elem] =
                        ((char **)lParse.colData[parNo].array)[elem-1]+alen;
                  ((char **)lParse.colData[parNo].array)[0][0] = '\0';
               } else {
                  free( lParse.colData[parNo].array );
                  *status = MEMORY_ALLOCATION;
               }
            } else {
               *status = MEMORY_ALLOCATION;
            }
         }
         break;
      }
      if( *status ) {
         while( parNo-- ) {
            if( lParse.colData[parNo].datatype==TSTRING )
               FREE( ((char **)lParse.colData[parNo].array)[0] );
            FREE( lParse.colData[parNo].array );
         }
         return( *status );
      }
   }
   
   /**********************************************************************/
   /* Read data from columns needed for the expression and then parse it */
   /**********************************************************************/
   
   if( !fits_uncompress_hkdata( &lParse, fptr, ntimes, times, status ) ) {
      if( constant ) {
         result = lParse.Nodes[lParse.resultNode].value.data.log;
         elem = ntimes;
         while( elem-- ) time_status[elem] = result;
      } else {
         Info.dataPtr  = time_status;
         Info.nullPtr  = NULL;
         Info.maxRows  = ntimes;
         *status       = fits_parser_workfn( ntimes, 0, 1, ntimes, lParse.nCols,
                                     lParse.colData, (void*)&Info );
      }
   }
   
   /************/
   /* Clean up */
   /************/
   
   parNo = lParse.nCols;
   while ( parNo-- ) {
      if( lParse.colData[parNo].datatype==TSTRING )
         FREE( ((char **)lParse.colData[parNo].array)[0] );
      FREE( lParse.colData[parNo].array );
   }
   
   if( constant ) lParse.nCols = nCol;

   ffcprs(&lParse);
   return(*status);
}